

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O1

Gia_Man_t * Gia_ManFraigCreateGia(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  long lVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *p_01;
  size_t sVar11;
  char *pcVar12;
  Gia_Obj_t *pGVar13;
  void *pvVar14;
  Gia_Man_t *pGVar15;
  ulong uVar16;
  long lVar17;
  
  if (p->pManTime == (void *)0x0) {
    __assert_fail("p->pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x104,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  if (0 < p->nObjs) {
    if (p->nTravIdsAlloc < 1) {
LAB_0072a0c3:
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x227,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar10 = p->pObjs;
    *p->pTravIds = p->nTravIds;
    p_00 = (Vec_Int_t *)malloc(0x10);
    p_00->nCap = 1000;
    p_00->nSize = 0;
    piVar8 = (int *)malloc(4000);
    p_00->pArray = piVar8;
    lVar9 = (long)p->nObjs;
    if (lVar9 < 1) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar7 = (uint)*(undefined8 *)(pGVar10 + lVar9 + -1);
    if ((-1 < (int)uVar7) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                    ,0x10c,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
    }
    pGVar10 = pGVar10 + lVar9 + -1;
    if ((~*(uint *)pGVar10 & 0x1fffffff) != 0 && (int)*(uint *)pGVar10 < 0) {
      iVar6 = 1;
      do {
        pGVar10 = Gia_ManFraigMarkCos(p,pGVar10,iVar6);
        if ((~*(uint *)pGVar10 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar10) {
          pGVar10 = Gia_ManFraigMarkAnd(p,pGVar10);
        }
        if (((undefined1  [12])*pGVar10 & (undefined1  [12])0x9fffffff) !=
            (undefined1  [12])0x9fffffff) {
          __assert_fail("Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                        ,0x112,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
        }
        iVar6 = Gia_ManFraigCheckCis(p,pGVar10);
        pGVar10 = Gia_ManFraigMarkCis(p,pGVar10,iVar6);
        Vec_IntPush(p_00,iVar6);
      } while (((int)(uint)*(undefined8 *)pGVar10 < 0) &&
              (((uint)*(undefined8 *)pGVar10 & 0x1fffffff) != 0x1fffffff));
    }
    iVar6 = p_00->nSize;
    if (iVar6 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x396,"int Vec_IntPop(Vec_Int_t *)");
    }
    piVar8 = p_00->pArray;
    iVar2 = iVar6 + -1;
    p_00->nSize = iVar2;
    if (2 < iVar6) {
      iVar6 = -1;
      lVar9 = 0;
      do {
        iVar1 = piVar8[lVar9];
        piVar8[lVar9] = piVar8[iVar2 + iVar6];
        piVar8[p_00->nSize + iVar6] = iVar1;
        lVar9 = lVar9 + 1;
        iVar2 = p_00->nSize;
        iVar6 = iVar6 + -1;
      } while (lVar9 < iVar2 / 2);
    }
    if ((~*(ulong *)pGVar10 & 0x1fffffff1fffffff) != 0) {
      __assert_fail("Gia_ObjIsConst0(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                    ,0x119,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
    }
    uVar7 = p->nObjs;
    uVar16 = (ulong)uVar7;
    if (1 < (int)uVar7) {
      pGVar10 = p->pObjs;
      lVar9 = 1;
      do {
        uVar7 = (uint)uVar16;
        pGVar10 = pGVar10 + 1;
        if (((undefined1  [12])*pGVar10 & (undefined1  [12])0x9fffffff) !=
            (undefined1  [12])0x9fffffff) break;
        if ((int)uVar7 <= lVar9) goto LAB_0072a066;
        if (p->nTravIdsAlloc <= lVar9) goto LAB_0072a0c3;
        p->pTravIds[lVar9] = p->nTravIds;
        lVar9 = lVar9 + 1;
        uVar7 = p->nObjs;
        uVar16 = (ulong)(int)uVar7;
      } while (lVar9 < (long)uVar16);
    }
    p_01 = Gia_ManStart(uVar7);
    pcVar4 = p->pName;
    if (pcVar4 == (char *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      sVar11 = strlen(pcVar4);
      pcVar12 = (char *)malloc(sVar11 + 1);
      strcpy(pcVar12,pcVar4);
    }
    p_01->pName = pcVar12;
    pcVar4 = p->pSpec;
    if (pcVar4 == (char *)0x0) {
      pcVar12 = (char *)0x0;
    }
    else {
      sVar11 = strlen(pcVar4);
      pcVar12 = (char *)malloc(sVar11 + 1);
      strcpy(pcVar12,pcVar4);
    }
    p_01->pSpec = pcVar12;
    p->pObjs->Value = 0;
    if (1 < p->nObjs) {
      lVar17 = 1;
      lVar9 = 5;
      do {
        if (p->nTravIdsAlloc <= lVar17) {
          __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (p->pTravIds[lVar17] == p->nTravIds) {
          pGVar10 = p->pObjs;
          uVar16 = *(ulong *)((long)pGVar10 + lVar9 * 4 + -8);
          uVar7 = (uint)uVar16;
          if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
            pGVar13 = Gia_ManAppendObj(p_01);
            uVar16 = *(ulong *)pGVar13;
            *(ulong *)pGVar13 = uVar16 | 0x9fffffff;
            *(ulong *)pGVar13 =
                 uVar16 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar5 = p_01->pObjs;
            if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) goto LAB_0072a066;
            Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * -0x55555555);
            pGVar5 = p_01->pObjs;
            if ((pGVar13 < pGVar5) || (pGVar5 + p_01->nObjs <= pGVar13)) goto LAB_0072a066;
            iVar6 = (int)((ulong)((long)pGVar13 - (long)pGVar5) >> 2) * 0x55555556;
          }
          else {
            iVar6 = (int)(uVar16 & 0x1fffffff);
            if ((uVar16 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
              if ((-1 < (int)uVar7) || (iVar6 == 0x1fffffff)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                              ,0x12f,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
              }
              uVar3 = *(uint *)((long)pGVar10 + lVar9 * 4 + (ulong)(uint)(iVar6 << 2) * -3);
              if ((int)uVar3 < 0) goto LAB_0072a0e2;
              iVar6 = Gia_ManAppendCo(p_01,uVar3 ^ uVar7 >> 0x1d & 1);
            }
            else {
              uVar7 = *(uint *)((long)pGVar10 + lVar9 * 4 + (ulong)(uint)(iVar6 << 2) * -3);
              if (((int)uVar7 < 0) ||
                 (uVar3 = *(uint *)((long)pGVar10 +
                                   lVar9 * 4 + (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3),
                 (int)uVar3 < 0)) {
LAB_0072a0e2:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10f,"int Abc_LitNotCond(int, int)");
              }
              iVar6 = Gia_ManAppendAnd(p_01,uVar7 ^ (uint)(uVar16 >> 0x1d) & 1,
                                       uVar3 ^ (uint)(uVar16 >> 0x3d) & 1);
            }
          }
          *(int *)(&pGVar10->field_0x0 + lVar9 * 4) = iVar6;
        }
        lVar17 = lVar17 + 1;
        lVar9 = lVar9 + 3;
      } while (lVar17 < p->nObjs);
    }
    pvVar14 = Gia_ManUpdateTimMan(p,p_00);
    p_01->pManTime = pvVar14;
    if (p->pAigExtra == (Gia_Man_t *)0x0) {
      __assert_fail("p->pAigExtra != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                    ,0x134,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
    }
    if (p_01->pAigExtra == (Gia_Man_t *)0x0) {
      pGVar15 = Gia_ManUpdateExtraAig(p->pManTime,p->pAigExtra,p_00);
      p_01->pAigExtra = pGVar15;
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      return p_01;
    }
    __assert_fail("pNew->pAigExtra == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x135,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
LAB_0072a066:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManFraigCreateGia( Gia_Man_t * p )
{
    Vec_Int_t * vBoxPres;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, fLabelPos;
    assert( p->pManTime != NULL );
    // start marks
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    vBoxPres = Vec_IntAlloc( 1000 );
    // mark primary outputs
    fLabelPos = 1;
    pObj = Gia_ManObj( p, Gia_ManObjNum(p) - 1 );
    assert( Gia_ObjIsCo(pObj) );
    while ( Gia_ObjIsCo(pObj) )
    {
        pObj = Gia_ManFraigMarkCos( p, pObj, fLabelPos );
        if ( Gia_ObjIsAnd(pObj) )
            pObj = Gia_ManFraigMarkAnd( p, pObj );
        assert( Gia_ObjIsCi(pObj) );
        fLabelPos = Gia_ManFraigCheckCis(p, pObj);
        pObj = Gia_ManFraigMarkCis( p, pObj, fLabelPos );
        Vec_IntPush( vBoxPres, fLabelPos );
    }
    Vec_IntPop( vBoxPres );
    Vec_IntReverseOrder( vBoxPres );
    assert( Gia_ObjIsConst0(pObj) );
    // mark primary inputs
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) )
            Gia_ObjSetTravIdCurrent( p, pObj );
        else
            break;
    // duplicate marked entries
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    // update timing manager
    pNew->pManTime = Gia_ManUpdateTimMan( p, vBoxPres );
    // update extra STG
    assert( p->pAigExtra != NULL );
    assert( pNew->pAigExtra == NULL );
    pNew->pAigExtra = Gia_ManUpdateExtraAig( p->pManTime, p->pAigExtra, vBoxPres );
    Vec_IntFree( vBoxPres );
//    assert( Gia_ManPiNum(pNew) == Tim_ManCiNum(pNew->pManTime) );
//    assert( Gia_ManPoNum(pNew) == Tim_ManCoNum(pNew->pManTime) );
//    assert( Gia_ManPiNum(pNew) == Tim_ManPiNum(pNew->pManTime) + Gia_ManPoNum(pNew->pAigExtra) );
    return pNew;
}